

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  Wln_Ntk_t *pWVar6;
  Wln_Vec_t *pWVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  if (-1 < iObj) {
    uVar5 = (ulong)(uint)iObj;
    pWVar6 = p->pNtk;
    if (iObj < (pWVar6->vTypes).nSize) {
      switch((pWVar6->vTypes).pArray[uVar5]) {
      case 0:
      case 99:
        pcVar8 = (char *)0x0;
        break;
      case 1:
        pcVar8 = "pi";
        break;
      case 2:
        pcVar8 = "po";
        break;
      case 3:
        pcVar8 = "ci";
        break;
      case 4:
        pcVar8 = "co";
        break;
      case 5:
        pcVar8 = "fon";
        break;
      case 6:
        pcVar8 = "box";
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/abcOper.h"
                      ,0xe7,"const char *Abc_OperName(int)");
      case 0xb:
        pcVar8 = "buf";
        break;
      case 0xc:
        pcVar8 = "~";
        break;
      case 0xd:
      case 0x1e:
        pcVar8 = "&";
        break;
      case 0xe:
      case 0x1f:
        pcVar8 = "~&";
        break;
      case 0xf:
      case 0x20:
        pcVar8 = "|";
        break;
      case 0x10:
      case 0x21:
        pcVar8 = "~|";
        break;
      case 0x11:
      case 0x22:
        pcVar8 = "^";
        break;
      case 0x12:
      case 0x23:
        pcVar8 = "~^";
        break;
      case 0x15:
        pcVar8 = "mux";
        break;
      case 0x16:
        pcVar8 = "maj";
        break;
      case 0x24:
        pcVar8 = "!";
        break;
      case 0x25:
        pcVar8 = "&&";
        break;
      case 0x27:
        pcVar8 = "||";
        break;
      case 0x29:
        pcVar8 = "^^";
        break;
      case 0x32:
        pcVar8 = "+";
        break;
      case 0x33:
      case 0x3a:
        pcVar8 = "-";
        break;
      case 0x34:
      case 0x35:
        pcVar8 = "*";
        break;
      case 0x36:
        pcVar8 = "/";
        break;
      case 0x37:
        pcVar8 = "mod";
        break;
      case 0x38:
        pcVar8 = "%";
        break;
      case 0x39:
        pcVar8 = "**";
        break;
      case 0x3b:
        pcVar8 = "sqrt";
        break;
      case 0x3e:
        pcVar8 = "<";
        break;
      case 0x3f:
        pcVar8 = "<=";
        break;
      case 0x40:
        pcVar8 = ">=";
        break;
      case 0x41:
        pcVar8 = ">";
        break;
      case 0x42:
        pcVar8 = "==";
        break;
      case 0x43:
        pcVar8 = "!=";
        break;
      case 0x44:
        pcVar8 = "<<";
        break;
      case 0x45:
        pcVar8 = ">>";
        break;
      case 0x46:
        pcVar8 = "<<<";
        break;
      case 0x47:
        pcVar8 = ">>>";
        break;
      case 0x48:
        pcVar8 = "rotL";
        break;
      case 0x49:
        pcVar8 = "rotR";
        break;
      case 0x4b:
        pcVar8 = "lut";
        break;
      case 0x4d:
        pcVar8 = "table";
        break;
      case 0x59:
        pcVar8 = "DFFRSE";
        break;
      case 0x5b:
        pcVar8 = "[:]";
        break;
      case 0x5c:
        pcVar8 = "{}";
        break;
      case 0x5d:
        pcVar8 = "zPad";
        break;
      case 0x5e:
        pcVar8 = "sExt";
        break;
      case 0x5f:
        pcVar8 = "=>";
        break;
      case 0x60:
        pcVar8 = "squar";
        break;
      case 0x61:
        pcVar8 = "const";
      }
      if ((iObj < (pWVar6->vNameIds).nSize) && (iObj < (pWVar6->vInstIds).nSize)) {
        printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",uVar5,pcVar8,
               (ulong)(uint)(pWVar6->vNameIds).pArray[uVar5],
               (ulong)(uint)(pWVar6->vInstIds).pArray[uVar5],
               (ulong)(uint)pWVar6->vFanins[uVar5].nSize);
        pWVar6 = p->pNtk;
        pWVar7 = pWVar6->vFanins;
        if (0 < pWVar7[uVar5].nSize) {
          lVar12 = 0;
          do {
            uVar1 = (p->vFanins).nSize;
            if ((int)uVar1 <= iObj) goto LAB_00363d95;
            piVar4 = (p->vFanins).pArray;
            lVar11 = (long)piVar4[uVar5];
            if ((lVar11 < 0) || (uVar1 <= (uint)piVar4[uVar5])) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            iVar2 = piVar4[lVar11 + lVar12 * 2];
            lVar9 = (long)iVar2;
            if (lVar9 != 0) {
              if (pWVar7[lVar9].nSize == 0) {
                if ((iVar2 < 0) || ((pWVar6->vTypes).nSize <= iVar2)) goto LAB_00363d95;
                if ((pWVar6->vTypes).pArray[lVar9] != 3) goto LAB_00363d65;
              }
              printf("%5d ");
              uVar1 = piVar4[lVar11 + lVar12 * 2 + 1];
              uVar10 = (ulong)uVar1;
              if (uVar10 != 0) {
                if ((((int)uVar1 < 0) || (uVar3 = (p->vEdgeLinks).nSize, (int)uVar3 <= (int)uVar1))
                   || (uVar3 <= uVar1 + 1)) goto LAB_00363d95;
                piVar4 = (p->vEdgeLinks).pArray;
                printf("(%d : %d %d) ",uVar10,(ulong)(uint)piVar4[uVar10],
                       (ulong)(uint)piVar4[uVar1 + 1]);
              }
            }
LAB_00363d65:
            lVar12 = lVar12 + 1;
            pWVar6 = p->pNtk;
            pWVar7 = pWVar6->vFanins;
          } while (lVar12 < pWVar7[uVar5].nSize);
        }
        putchar(10);
        return;
      }
    }
  }
LAB_00363d95:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}